

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

int __thiscall
glslang::TReflectionTraverser::countAggregateMembers(TReflectionTraverser *this,TType *parentType)

{
  EShReflectionOptions EVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  TType *pTVar5;
  const_reference pvVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool bVar7;
  int local_4c;
  int numMembers;
  TType *memberType;
  size_t i;
  int ret;
  TTypeList *memberList;
  bool blockParent;
  bool strictArraySuffix;
  TType *parentType_local;
  TReflectionTraverser *this_local;
  
  uVar3 = (*parentType->_vptr_TType[0x25])();
  if ((uVar3 & 1) == 0) {
    this_local._4_4_ = 1;
  }
  else {
    EVar1 = this->reflection->options;
    iVar4 = (*parentType->_vptr_TType[7])();
    bVar7 = false;
    if (iVar4 == 0x10) {
      iVar4 = (*parentType->_vptr_TType[0xb])();
      bVar7 = ((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f) == 6;
    }
    this_00 = &TType::getStruct(parentType)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    i._4_4_ = 0;
    for (memberType = (TType *)0x0;
        pTVar5 = (TType *)std::
                          vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                          size(this_00), memberType < pTVar5;
        memberType = (TType *)((long)&memberType->_vptr_TType + 1)) {
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](this_00,(size_type)memberType);
      pTVar5 = pvVar6->type;
      local_4c = countAggregateMembers(this,pTVar5);
      uVar3 = (*pTVar5->_vptr_TType[0x1d])();
      if ((uVar3 & 1) != 0) {
        iVar4 = (*pTVar5->_vptr_TType[0x13])();
        bVar2 = TArraySizes::hasUnsized((TArraySizes *)CONCAT44(extraout_var_00,iVar4));
        if (((!bVar2) && (uVar3 = (*pTVar5->_vptr_TType[0x25])(), (uVar3 & 1) != 0)) &&
           (((EVar1 & EShReflectionStrictArraySuffix) == EShReflectionDefault || (!bVar7)))) {
          iVar4 = (*pTVar5->_vptr_TType[0x13])();
          iVar4 = TArraySizes::getCumulativeSize((TArraySizes *)CONCAT44(extraout_var_01,iVar4));
          local_4c = iVar4 * local_4c;
        }
      }
      i._4_4_ = local_4c + i._4_4_;
    }
    this_local._4_4_ = i._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int countAggregateMembers(const TType& parentType)
    {
        if (! parentType.isStruct())
            return 1;

        const bool strictArraySuffix = (reflection.options & EShReflectionStrictArraySuffix);

        bool blockParent = (parentType.getBasicType() == EbtBlock && parentType.getQualifier().storage == EvqBuffer);

        const TTypeList &memberList = *parentType.getStruct();

        int ret = 0;

        for (size_t i = 0; i < memberList.size(); i++)
        {
            const TType &memberType = *memberList[i].type;
            int numMembers = countAggregateMembers(memberType);
            // for sized arrays of structs, apply logic to expand out the same as we would below in
            // blowUpActiveAggregate
            if (memberType.isArray() && ! memberType.getArraySizes()->hasUnsized() && memberType.isStruct()) {
                if (! strictArraySuffix || ! blockParent)
                    numMembers *= memberType.getArraySizes()->getCumulativeSize();
            }
            ret += numMembers;
        }

        return ret;
    }